

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::Trace(GlobOpt *this,BasicBlock *block,bool before)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  BasicBlock *pBVar12;
  undefined4 *puVar13;
  char16_t *pcVar14;
  uint uVar15;
  
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar10,uVar11);
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypeSpecPhase,uVar10,uVar11);
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FloatTypeSpecPhase,uVar10,uVar11);
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FieldCopyPropPhase,uVar10,uVar11);
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar10,uVar11);
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ValueTablePhase,uVar10,uVar11);
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FieldPREPhase,uVar10,uVar11);
  if ((((bVar7) || (bVar6)) || (bVar5)) || (((bVar4 || (bVar8)) || ((bVar3 || (bVar9)))))) {
    if (((bVar9) && (this->prePassLoop != (Loop *)0x0)) && (before && (block->field_0x18 & 4) != 0))
    {
      pBVar12 = Loop::GetHeadBlock(this->prePassLoop);
      Output::Print(L"====  Loop Prepass block header #%-3d,  Visiting Loop block head #%-3d\n",
                    (ulong)pBVar12->number,(ulong)block->number);
    }
    if (((bVar4 || bVar5) || bVar8) || (DAT_0145948a == '\x01')) {
      if (before) {
        uVar15 = 0;
        Output::Print(L"========================================================================\n")
        ;
        Output::Print(L"Begin OptBlock: Block #%-3d",(ulong)block->number);
        if (block->loop != (Loop *)0x0) {
          pBVar12 = Loop::GetHeadBlock(block->loop);
          uVar1 = pBVar12->number;
          if (this->prePassLoop == (Loop *)0x0) {
            pcVar14 = L"";
          }
          else {
            pBVar12 = Loop::GetHeadBlock(this->prePassLoop);
            uVar15 = pBVar12->number;
            pcVar14 = L"PrePass";
            if (this->prePassLoop == (Loop *)0x0) {
              pcVar14 = L"";
            }
          }
          Output::Print(L"     Loop block header:%-3d  currentLoop block head:%-3d   %s",
                        (ulong)uVar1,(ulong)uVar15,pcVar14);
        }
        Output::Print(L"\n");
      }
      else {
        Output::Print(L"-----------------------------------------------------------------------\n");
        Output::Print(L"After OptBlock: Block #%-3d\n",(ulong)block->number);
      }
      if ((bVar4 || bVar5) &&
         (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveVarSyms),
         !bVar3)) {
        Output::Print(L"    Live var syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveVarSyms);
      }
      if ((bVar4) &&
         (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveInt32Syms),
         !bVar3)) {
        bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->tempBv);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar13 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x4145,"(this->tempBv->IsEmpty())","this->tempBv->IsEmpty()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar13 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (this->tempBv,(block->globOptData).liveInt32Syms,
                   (block->globOptData).liveLossyInt32Syms);
        bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->tempBv);
        if (!bVar3) {
          Output::Print(L"    Int32 type specialized (lossless) syms: ");
          BVSparse<Memory::JitArenaAllocator>::Dump(this->tempBv);
        }
        BVSparse<Memory::JitArenaAllocator>::ClearAll(this->tempBv);
        bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((block->globOptData).liveLossyInt32Syms);
        if (!bVar3) {
          Output::Print(L"    Int32 converted (lossy) syms: ");
          BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveLossyInt32Syms);
        }
      }
      if ((bVar5) &&
         (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveFloat64Syms)
         , !bVar3)) {
        Output::Print(L"    Float64 type specialized syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveFloat64Syms);
      }
      if (((bVar6 || bVar7) && (bVar3 = DoFieldCopyProp(this,block->loop), bVar3)) &&
         (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveFields),
         !bVar3)) {
        Output::Print(L"    Live field syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveFields);
      }
      if (bVar7 || bVar8) {
        Output::Print(L"    Value table:\n");
        GlobOptBlockData::DumpSymToValueMap(&block->globOptData);
      }
      if (before) {
        Output::Print(L"-----------------------------------------------------------------------\n");
      }
      Output::Flush();
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::Trace(BasicBlock * block, bool before) const
{
    bool globOptTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool typeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::TypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool floatTypeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FloatTypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool fieldCopyPropTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool objTypeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::ObjTypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool valueTableTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::ValueTablePhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool fieldPRETrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());

    bool anyTrace = globOptTrace || typeSpecTrace || floatTypeSpecTrace || fieldCopyPropTrace || objTypeSpecTrace || valueTableTrace || fieldPRETrace;

    if (!anyTrace)
    {
        return;
    }

    if (fieldPRETrace && this->IsLoopPrePass())
    {
        if (block->isLoopHeader && before)
        {
            Output::Print(_u("====  Loop Prepass block header #%-3d,  Visiting Loop block head #%-3d\n"),
                this->prePassLoop->GetHeadBlock()->GetBlockNum(), block->GetBlockNum());
        }
    }

    if (!typeSpecTrace && !floatTypeSpecTrace && !valueTableTrace && !Js::Configuration::Global.flags.Verbose)
    {
        return;
    }

    if (before)
    {
        Output::Print(_u("========================================================================\n"));
        Output::Print(_u("Begin OptBlock: Block #%-3d"), block->GetBlockNum());
        if (block->loop)
        {
            Output::Print(_u("     Loop block header:%-3d  currentLoop block head:%-3d   %s"),
                block->loop->GetHeadBlock()->GetBlockNum(),
                this->prePassLoop ? this->prePassLoop->GetHeadBlock()->GetBlockNum() : 0,
                this->IsLoopPrePass() ? _u("PrePass") : _u(""));
        }
        Output::Print(_u("\n"));
    }
    else
    {
        Output::Print(_u("-----------------------------------------------------------------------\n"));
        Output::Print(_u("After OptBlock: Block #%-3d\n"), block->GetBlockNum());
    }
    if ((typeSpecTrace || floatTypeSpecTrace) && !block->globOptData.liveVarSyms->IsEmpty())
    {
        Output::Print(_u("    Live var syms: "));
        block->globOptData.liveVarSyms->Dump();
    }
    if (typeSpecTrace && !block->globOptData.liveInt32Syms->IsEmpty())
    {
        Assert(this->tempBv->IsEmpty());
        this->tempBv->Minus(block->globOptData.liveInt32Syms, block->globOptData.liveLossyInt32Syms);
        if(!this->tempBv->IsEmpty())
        {
            Output::Print(_u("    Int32 type specialized (lossless) syms: "));
            this->tempBv->Dump();
        }
        this->tempBv->ClearAll();
        if(!block->globOptData.liveLossyInt32Syms->IsEmpty())
        {
            Output::Print(_u("    Int32 converted (lossy) syms: "));
            block->globOptData.liveLossyInt32Syms->Dump();
        }
    }
    if (floatTypeSpecTrace && !block->globOptData.liveFloat64Syms->IsEmpty())
    {
        Output::Print(_u("    Float64 type specialized syms: "));
        block->globOptData.liveFloat64Syms->Dump();
    }
    if ((fieldCopyPropTrace || objTypeSpecTrace) && this->DoFieldCopyProp(block->loop) && !block->globOptData.liveFields->IsEmpty())
    {
        Output::Print(_u("    Live field syms: "));
        block->globOptData.liveFields->Dump();
    }
    if (objTypeSpecTrace || valueTableTrace)
    {
        Output::Print(_u("    Value table:\n"));
        block->globOptData.DumpSymToValueMap();
    }

    if (before)
    {
        Output::Print(_u("-----------------------------------------------------------------------\n")); \
    }

    Output::Flush();
}